

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_SetAssetReissuanceListTest_multi_Test::TestBody
          (ConfidentialTransaction_SetAssetReissuanceListTest_multi_Test *this)

{
  _func_int **lhs;
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> amount_list;
  IssuanceParameter local_3a8;
  string local_338;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> script_list;
  Amount local_2f8;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> nonce_list;
  Script script1;
  AssertionResult gtest_ar_1;
  value_type local_280;
  IssuanceParameter param;
  value_type local_200;
  ConfidentialTransaction tx;
  Script script2;
  ConfidentialNonce nonce1;
  ConfidentialNonce nonce2;
  ConfidentialTransaction tx_base;
  BlindFactor entropy;
  BlindFactor blind_factor;
  ConfidentialTransaction expect_tx2;
  ConfidentialTransaction expect_tx1;
  
  std::__cxx11::string::string
            ((string *)&param,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000"
             ,(allocator *)&local_3a8);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx_base,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  std::__cxx11::string::string
            ((string *)&param,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000003017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000"
             ,(allocator *)&local_3a8);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&expect_tx1,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  std::__cxx11::string::string
            ((string *)&param,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000005017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000011e1a30003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac01cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000017d7840002074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa16001435ef6d4b59f26089dfe2abca21408e15fee42a3300000000"
             ,(allocator *)&local_3a8);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&expect_tx2,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,&tx_base);
  AVar3 = cfd::core::Amount::CreateByCoinAmount(7.0);
  local_2f8.amount_ = AVar3.amount_;
  local_2f8.ignore_check_ = AVar3.ignore_check_;
  std::__cxx11::string::string
            ((string *)&param,"c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf",
             (allocator *)&local_3a8);
  cfd::core::BlindFactor::BlindFactor(&blind_factor,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  std::__cxx11::string::string
            ((string *)&param,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",
             (allocator *)&local_3a8);
  cfd::core::BlindFactor::BlindFactor(&entropy,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  cfd::core::IssuanceParameter::IssuanceParameter(&param);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetAssetReissuance
                (&local_3a8,&tx,1,&local_2f8,&amount_list,&script_list,&nonce_list,&blind_factor,
                 &entropy);
      cfd::core::IssuanceParameter::operator=(&param,&local_3a8);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_3a8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&script1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x583,
               "Expected: (param = tx.SetAssetReissuance(1, amount, amount_list, script_list, nonce_list, blind_factor, entropy)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&script1,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a8);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_3a8,&tx.super_AbstractTransaction);
  lhs = local_3a8.entropy._vptr_BlindFactor;
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&script1,&expect_tx1.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&script2,"tx.GetHex().c_str()","expect_tx1.GetHex().c_str()",(char *)lhs,
             (char *)script1._vptr_Script);
  std::__cxx11::string::~string((string *)&script1);
  std::__cxx11::string::~string((string *)&local_3a8);
  if ((char)script2._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_3a8);
    if (script2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)script2.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&script1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x584,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&script1,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script2.script_data_);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&local_3a8,&tx_base);
  cfd::core::ConfidentialTransaction::operator=(&tx,(ConfidentialTransaction *)&local_3a8);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&local_3a8);
  AVar3 = cfd::core::Amount::CreateByCoinAmount(3.0);
  local_280.amount_ = AVar3.amount_;
  local_280.ignore_check_ = AVar3.ignore_check_;
  AVar3 = cfd::core::Amount::CreateByCoinAmount(4.0);
  local_200.amount_ = AVar3.amount_;
  local_200.ignore_check_ = AVar3.ignore_check_;
  std::__cxx11::string::string
            ((string *)&local_3a8,"76a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac",
             (allocator *)&script2);
  cfd::core::Script::Script(&script1,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::string
            ((string *)&local_3a8,"001435ef6d4b59f26089dfe2abca21408e15fee42a33",
             (allocator *)&nonce1);
  cfd::core::Script::Script(&script2,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::string
            ((string *)&local_3a8,
             "03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef311687",
             (allocator *)&nonce2);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&nonce1,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::string
            ((string *)&local_3a8,
             "02074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa",
             (allocator *)&local_338);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&nonce2,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&amount_list,&local_280);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&script_list,&script1);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&nonce_list,&nonce1);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&amount_list,&local_200);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&script_list,&script2);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&nonce_list,&nonce2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetAssetReissuance
                (&local_3a8,&tx,1,&local_2f8,&amount_list,&script_list,&nonce_list,&blind_factor,
                 &entropy);
      cfd::core::IssuanceParameter::operator=(&param,&local_3a8);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_3a8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x596,
               "Expected: (param = tx.SetAssetReissuance(1, amount, amount_list, script_list, nonce_list, blind_factor, entropy)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a8);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_3a8,&tx.super_AbstractTransaction);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_338,&expect_tx2.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"tx.GetHex().c_str()","expect_tx2.GetHex().c_str()",
             (char *)local_3a8.entropy._vptr_BlindFactor,local_338._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_3a8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_3a8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x597,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&local_3a8,&tx_base);
  cfd::core::ConfidentialTransaction::operator=(&tx,(ConfidentialTransaction *)&local_3a8);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&local_3a8);
  if (amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
      super__Vector_impl_data._M_start) {
    amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
    super__Vector_impl_data._M_finish =
         amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear(&script_list);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            (&nonce_list);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&amount_list,&local_2f8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::ConfidentialTransaction::SetAssetReissuance
              (&local_3a8,&tx,1,&local_2f8,&amount_list,&script_list,&nonce_list,&blind_factor,
               &entropy);
    cfd::core::IssuanceParameter::operator=(&param,&local_3a8);
    cfd::core::IssuanceParameter::~IssuanceParameter(&local_3a8);
  }
  testing::Message::Message((Message *)&local_3a8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x5a1,
             "Expected: param = tx.SetAssetReissuance(1, amount, amount_list, script_list, nonce_list, blind_factor, entropy) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_3a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_3a8);
  if (amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
      super__Vector_impl_data._M_start) {
    amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
    super__Vector_impl_data._M_finish =
         amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&script_list,&script1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::ConfidentialTransaction::SetAssetReissuance
              (&local_3a8,&tx_base,1,&local_2f8,&amount_list,&script_list,&nonce_list,&blind_factor,
               &entropy);
    cfd::core::IssuanceParameter::operator=(&param,&local_3a8);
    cfd::core::IssuanceParameter::~IssuanceParameter(&local_3a8);
  }
  testing::Message::Message((Message *)&local_3a8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x5a5,
             "Expected: param = tx_base.SetAssetReissuance(1, amount, amount_list, script_list, nonce_list, blind_factor, entropy) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_3a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_3a8);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear(&script_list);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&local_3a8,&tx_base);
  cfd::core::ConfidentialTransaction::operator=(&tx,(ConfidentialTransaction *)&local_3a8);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&local_3a8);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&amount_list,&local_280);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&script_list,&script1);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&nonce_list,&nonce1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::ConfidentialTransaction::SetAssetReissuance
              (&local_3a8,&tx,1,&local_2f8,&amount_list,&script_list,&nonce_list,&blind_factor,
               &entropy);
    cfd::core::IssuanceParameter::operator=(&param,&local_3a8);
    cfd::core::IssuanceParameter::~IssuanceParameter(&local_3a8);
  }
  testing::Message::Message((Message *)&local_3a8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x5af,
             "Expected: param = tx.SetAssetReissuance(1, amount, amount_list, script_list, nonce_list, blind_factor, entropy) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_3a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_3a8);
  if (amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
      super__Vector_impl_data._M_start) {
    amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
    super__Vector_impl_data._M_finish =
         amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&nonce2);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&nonce1);
  cfd::core::Script::~Script(&script2);
  cfd::core::Script::~Script(&script1);
  cfd::core::IssuanceParameter::~IssuanceParameter(&param);
  cfd::core::BlindFactor::~BlindFactor(&entropy);
  cfd::core::BlindFactor::~BlindFactor(&blind_factor);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            (&nonce_list);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&script_list);
  std::_Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~_Vector_base
            (&amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)
  ;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&expect_tx2);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&expect_tx1);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx_base);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetAssetReissuanceListTest_multi) {
  ConfidentialTransaction tx_base(
      "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
  ConfidentialTransaction expect_tx1(
      "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000003017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
  ConfidentialTransaction expect_tx2(
      "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000005017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000011e1a30003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac01cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000017d7840002074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa16001435ef6d4b59f26089dfe2abca21408e15fee42a3300000000");

  std::vector<Amount> amount_list;
  std::vector<Script> script_list;
  std::vector<ConfidentialNonce> nonce_list;

  // empty check
  ConfidentialTransaction tx(tx_base);
  Amount amount = Amount::CreateByCoinAmount(7.0);
  BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
  BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");
  IssuanceParameter param;
  EXPECT_NO_THROW(
      (param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx1.GetHex().c_str());

  // 2-output check
  tx = ConfidentialTransaction(tx_base);
  Amount amount1 = Amount::CreateByCoinAmount(3.0);
  Amount amount2 = Amount::CreateByCoinAmount(4.0);
  Script script1("76a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac");
  Script script2("001435ef6d4b59f26089dfe2abca21408e15fee42a33");
  ConfidentialNonce nonce1("03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef311687");
  ConfidentialNonce nonce2("02074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa");
  amount_list.push_back(amount1);
  script_list.push_back(script1);
  nonce_list.push_back(nonce1);
  amount_list.push_back(amount2);
  script_list.push_back(script2);
  nonce_list.push_back(nonce2);
  EXPECT_NO_THROW(
      (param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx2.GetHex().c_str());

  // error (count unmatch)
  {
    tx = ConfidentialTransaction(tx_base);
    amount_list.clear();
    script_list.clear();
    nonce_list.clear();
    amount_list.push_back(amount);
    EXPECT_THROW(param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy), CfdException);
    amount_list.clear();
    script_list.push_back(script1);
    EXPECT_THROW(param = tx_base.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy), CfdException);
    script_list.clear();
  }
  // error (amount unmatch)
  {
    tx = ConfidentialTransaction(tx_base);
    amount_list.push_back(amount1);
    script_list.push_back(script1);
    nonce_list.push_back(nonce1);
    EXPECT_THROW(param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy), CfdException);
    amount_list.clear();
  }
}